

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O1

void __thiscall
bloaty::RangeMapTest_UnknownSize3_Test::RangeMapTest_UnknownSize3_Test
          (RangeMapTest_UnknownSize3_Test *this)

{
  _Rb_tree_header *p_Var1;
  
  testing::Test::Test((Test *)this);
  p_Var1 = &(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)&(this->super_RangeMapTest).kNoTranslation = 0xffffffff;
  *(undefined4 *)((long)&(this->super_RangeMapTest).kNoTranslation + 4) = 0xffffffff;
  *(undefined4 *)&(this->super_RangeMapTest).kUnknownSize = 0xffffffff;
  *(undefined4 *)((long)&(this->super_RangeMapTest).kUnknownSize + 4) = 0xffffffff;
  (this->super_RangeMapTest).super_Test._vptr_Test = (_func_int **)&PTR__RangeMapTest_0062b868;
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize3) {
  map_.AddRange(100, kUnknownSize, "foo");
  map_.AddRange(150, kUnknownSize, "bar");
  // This tells us the ultimate size of "foo", and we keep the "foo" label even
  // though the new label is "baz".
  map_.AddRange(100, 100, "baz");
  AssertMainMapEquals({
    {100, 150, kNoTranslation, "foo"},
    {150, 200, kNoTranslation, "bar"},
  });
}